

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<std::__cxx11::wstring>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *needle,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *haystack)

{
  bool bVar1;
  AssertionResult *pAVar3;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  undefined1 auVar5 [16];
  AssertionResult AVar6;
  char *begin_string_quote;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  AssertionResult local_38;
  undefined8 uVar2;
  
  local_50 = haystack_expr;
  local_48 = needle_expr;
  auVar5 = std::__cxx11::wstring::find((wchar_t *)haystack,(ulong)(needle->_M_dataplus)._M_p,0);
  sVar4.ptr_ = auVar5._8_8_;
  bVar1 = (auVar5._0_8_ != -1) != expected_to_be_substring;
  uVar2 = CONCAT71(auVar5._1_7_,bVar1);
  if (bVar1) {
    local_58 = "L\"";
    local_38.success_ = false;
    local_38.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar3 = AssertionResult::operator<<(&local_38,(char (*) [11])"Value of: ");
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_48);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x1484b1);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x147dac);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_58);
    pAVar3 = AssertionResult::operator<<(pAVar3,needle);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x14856a);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x147db8);
    local_40 = "not ";
    if (expected_to_be_substring) {
      local_40 = "";
    }
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_40);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [16])"a substring of ");
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_50);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x1484b1);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x147dd5);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_58);
    pAVar3 = AssertionResult::operator<<(pAVar3,haystack);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x147e96);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar3);
    internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar2 = extraout_RAX;
    sVar4.ptr_ = extraout_RDX;
  }
  else {
    *this = (_anonymous_namespace_)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  AVar6.message_.ptr_ = sVar4.ptr_;
  AVar6._0_8_ = uVar2;
  return AVar6;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"";
}